

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismExtend.cpp
# Opt level: O3

int pztopology::Pr<pztopology::TPZPoint>::SideDimension(int side)

{
  uint uVar1;
  long *plVar2;
  
  if ((uint)side < 3) {
    uVar1 = (uint)(side == 2);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Pr<TFather>::SideDimension side ",0x20);
    plVar2 = (long *)std::ostream::operator<<(&std::cerr,side);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    uVar1 = 0xffffffff;
  }
  return uVar1;
}

Assistant:

int Pr<TFather>::SideDimension(int side) {
		if(side<0 || side >= NSides) {
			PZError << "Pr<TFather>::SideDimension side " << side << endl;
			return -1;
		}
		int ftns = side/TFather::NSides;
		int fatherside = side%TFather::NSides;
		if(ftns < 2) return TFather::SideDimension(fatherside);
		return TFather::SideDimension(fatherside)+1;
	}